

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::java::EnumLiteGenerator::CanUseEnumValues(EnumLiteGenerator *this)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  EnumValueDescriptor *this_00;
  string *__lhs;
  reference ppEVar4;
  string *__rhs;
  int local_1c;
  int i;
  EnumLiteGenerator *this_local;
  
  sVar3 = std::
          vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
          ::size(&this->canonical_values_);
  iVar2 = EnumDescriptor::value_count(this->descriptor_);
  if (sVar3 == (long)iVar2) {
    for (local_1c = 0; iVar2 = EnumDescriptor::value_count(this->descriptor_), local_1c < iVar2;
        local_1c = local_1c + 1) {
      this_00 = EnumDescriptor::value(this->descriptor_,local_1c);
      __lhs = EnumValueDescriptor::name_abi_cxx11_(this_00);
      ppEVar4 = std::
                vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ::operator[](&this->canonical_values_,(long)local_1c);
      __rhs = EnumValueDescriptor::name_abi_cxx11_(*ppEVar4);
      bVar1 = std::operator!=(__lhs,__rhs);
      if (bVar1) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool EnumLiteGenerator::CanUseEnumValues() {
  if (canonical_values_.size() != descriptor_->value_count()) {
    return false;
  }
  for (int i = 0; i < descriptor_->value_count(); i++) {
    if (descriptor_->value(i)->name() != canonical_values_[i]->name()) {
      return false;
    }
  }
  return true;
}